

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.cpp
# Opt level: O1

int __thiscall ncnn::Embed::forward(Embed *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  uint _h;
  ulong uVar4;
  int iVar5;
  void *__dest;
  
  _h = bottom_blob->c * (int)bottom_blob->cstep;
  Mat::create(top_blob,this->num_output,_h,4,opt->blob_allocator);
  iVar2 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (0 < (int)_h) {
      uVar4 = 0;
      do {
        __dest = (void *)((long)(top_blob->w * (int)uVar4) * top_blob->elemsize +
                         (long)top_blob->data);
        iVar2 = *(int *)((long)bottom_blob->data + uVar4 * 4);
        if (iVar2 < 1) {
          iVar2 = 0;
        }
        iVar5 = this->input_dim + -1;
        if (iVar2 < this->input_dim) {
          iVar5 = iVar2;
        }
        memcpy(__dest,(void *)((long)iVar5 * (long)this->num_output * 4 +
                              (long)(this->weight_data).data),(long)this->num_output << 2);
        if ((this->bias_term != 0) && (iVar2 = this->num_output, 0 < (long)iVar2)) {
          pvVar1 = (this->bias_data).data;
          lVar3 = 0;
          do {
            *(float *)((long)__dest + lVar3 * 4) =
                 *(float *)((long)__dest + lVar3 * 4) + *(float *)((long)pvVar1 + lVar3 * 4);
            lVar3 = lVar3 + 1;
          } while (iVar2 != lVar3);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != _h);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int Embed::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int words = static_cast<int>(bottom_blob.total());

    top_blob.create(num_output, words, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<words; q++)
    {
        float* outptr = top_blob.row(q);

        int word_index = ((const int*)bottom_blob)[q];

        if (word_index < 0)
            word_index = 0;
        if (word_index >= input_dim)
            word_index = input_dim - 1;

        const float* em = (const float*)weight_data + num_output * word_index;

        memcpy(outptr, em, num_output * sizeof(float));

        if (bias_term)
        {
            for (int p=0; p<num_output; p++)
            {
                outptr[p] += bias_data[p];
            }
        }
    }

    return 0;
}